

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::assignPWproduct4setup<double,double>
          (SSVectorBase<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  clear(this);
  this->setupStatus = false;
  iVar15 = (x->super_IdxSet).num;
  iVar1 = (y->super_IdxSet).num;
  if (0 < (long)iVar1 && 0 < (long)iVar15) {
    lVar12 = (long)iVar15 + -1;
    lVar8 = (long)iVar1 + -1;
    piVar2 = (x->super_IdxSet).idx;
    iVar9 = *piVar2;
    piVar3 = (y->super_IdxSet).idx;
    iVar13 = *piVar3;
    iVar14 = 0;
    iVar11 = (int)lVar12;
    iVar7 = (int)lVar8;
    if (iVar1 < 2 || iVar15 < 2) {
      iVar15 = 0;
    }
    else {
      pdVar4 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (y->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar15 = 0;
      iVar14 = 0;
      do {
        if (iVar9 == iVar13) {
          pdVar6[iVar9] = pdVar4[iVar9] * pdVar5[iVar9];
          lVar10 = (long)iVar15;
          iVar15 = iVar15 + 1;
          iVar9 = piVar2[lVar10 + 1];
LAB_00207788:
          lVar10 = (long)iVar14;
          iVar14 = iVar14 + 1;
          iVar13 = piVar3[lVar10 + 1];
        }
        else {
          if (iVar13 <= iVar9) goto LAB_00207788;
          lVar10 = (long)iVar15;
          iVar15 = iVar15 + 1;
          iVar9 = piVar2[lVar10 + 1];
        }
      } while ((iVar15 < iVar11) && (iVar14 < iVar7));
    }
    if ((iVar15 < iVar11) && (iVar9 != iVar13)) {
      lVar10 = (long)iVar15;
      do {
        lVar10 = lVar10 + 1;
        iVar9 = piVar2[lVar10];
        if (lVar12 <= lVar10) break;
      } while (iVar9 != iVar13);
    }
    if ((iVar14 < iVar7) && (iVar9 != iVar13)) {
      lVar12 = (long)iVar14;
      do {
        lVar12 = lVar12 + 1;
        iVar13 = piVar3[lVar12];
        if (lVar8 <= lVar12) break;
      } while (iVar9 != iVar13);
    }
    if (iVar9 == iVar13) {
      (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar9] =
           (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar9] *
           (y->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar9];
    }
  }
  setup(this);
  return this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assignPWproduct4setup(const SSVectorBase<S>& x,
      const SSVectorBase<T>& y)
{
   assert(dim() == x.dim());
   assert(x.dim() == y.dim());
   assert(x.isSetup());
   assert(y.isSetup());

   clear();
   setupStatus = false;

   int i = 0;
   int j = 0;
   int n = x.size() - 1;
   int m = y.size() - 1;

   /* both x and y non-zero vectors? */
   if(m >= 0 && n >= 0)
   {
      int xi = x.index(i);
      int yj = y.index(j);

      while(i < n && j < m)
      {
         if(xi == yj)
         {
            VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
            xi = x.index(++i);
            yj = y.index(++j);
         }
         else if(xi < yj)
            xi = x.index(++i);
         else
            yj = y.index(++j);
      }

      /* check (possible) remaining indices */

      while(i < n && xi != yj)
         xi = x.index(++i);

      while(j < m && xi != yj)
         yj = y.index(++j);

      if(xi == yj)
         VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
   }

   setup();

   assert(isConsistent());

   return *this;
}